

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_cipher_update(psa_cipher_operation_t *operation,uint8_t *input,size_t input_length,
                 uint8_t *output,size_t output_size,size_t *output_length)

{
  int ret;
  psa_status_t pVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (operation->alg == 0) {
    pVar1 = -0x89;
  }
  else {
    sVar3 = input_length;
    if ((operation->alg & 0x7f800000) != 0x4800000) {
      uVar2 = (operation->ctx).cipher.unprocessed_len + input_length;
      sVar3 = uVar2 - uVar2 % (ulong)operation->block_size;
    }
    pVar1 = -0x8a;
    if (sVar3 <= output_size) {
      ret = mbedtls_cipher_update(&(operation->ctx).cipher,input,input_length,output,output_length);
      pVar1 = mbedtls_to_psa_error(ret);
    }
    if (pVar1 != 0) {
      psa_cipher_abort(operation);
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_cipher_update( psa_cipher_operation_t *operation,
                                const uint8_t *input,
                                size_t input_length,
                                uint8_t *output,
                                size_t output_size,
                                size_t *output_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t expected_output_size;

    if( operation->alg == 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    if( ! PSA_ALG_IS_STREAM_CIPHER( operation->alg ) )
    {
        /* Take the unprocessed partial block left over from previous
         * update calls, if any, plus the input to this call. Remove
         * the last partial block, if any. You get the data that will be
         * output in this call. */
        expected_output_size =
            ( operation->ctx.cipher.unprocessed_len + input_length )
            / operation->block_size * operation->block_size;
    }
    else
    {
        expected_output_size = input_length;
    }

    if( output_size < expected_output_size )
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto exit;
    }

    ret = mbedtls_cipher_update( &operation->ctx.cipher, input,
                                 input_length, output, output_length );
    status = mbedtls_to_psa_error( ret );
exit:
    if( status != PSA_SUCCESS )
        psa_cipher_abort( operation );
    return( status );
}